

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpBBs
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *graph,int ind)

{
  int indent;
  bool bVar1;
  iterator this_00;
  reference ppVar2;
  ostream *os;
  ostream *poVar3;
  int in_EDX;
  DependenceGraph<dg::LLVMNode> *in_RSI;
  long in_RDI;
  pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*> it_1;
  iterator __end0_1;
  iterator __begin0_1;
  BBlocksMapT *__range4;
  pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*> it;
  iterator __end0;
  iterator __begin0;
  BBlocksMapT *__range3;
  undefined4 in_stack_00000070;
  map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
  *in_stack_ffffffffffffff78;
  _Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>
  *in_stack_ffffffffffffff80;
  _Self local_60;
  _Self local_58;
  BBlocksMapT *local_50;
  Indent local_44 [2];
  _Self local_28;
  BBlocksMapT *local_20;
  int local_14;
  DependenceGraph<dg::LLVMNode> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_20 = DependenceGraph<dg::LLVMNode>::getBlocks(in_RSI);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
       ::begin(in_stack_ffffffffffffff78);
  this_00 = std::
            map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
            ::end(in_stack_ffffffffffffff78);
  while (bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::
             operator*((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>
                        *)0x1c8d71);
    indent = (int)((ulong)ppVar2->first >> 0x20);
    unique0x10000223 = ppVar2->first;
    dumpBB((DG2Dot<dg::LLVMNode> *)this_00._M_node,ppVar2->second,indent);
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::operator++
              (in_stack_ffffffffffffff80);
  }
  if ((*(uint *)(in_RDI + 0x68) & 3) != 0) {
    os = (ostream *)(in_RDI + 0xd0);
    Indent::Indent(local_44,local_14);
    poVar3 = debug::operator<<(os,(Indent *)in_stack_ffffffffffffff78);
    std::operator<<(poVar3,"/* CFG edges */\n");
    local_50 = DependenceGraph<dg::LLVMNode>::getBlocks(local_10);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
         ::begin(in_stack_ffffffffffffff78);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
         ::end(in_stack_ffffffffffffff78);
    while (bVar1 = std::operator!=(&local_58,&local_60), bVar1) {
      std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::operator*
                ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_> *)
                 0x1c8e3d);
      dumpBBedges((DG2Dot<dg::LLVMNode> *)CONCAT44(ind,in_stack_00000070),
                  (BBlock<dg::LLVMNode> *)__range3,__begin0._M_node._4_4_);
      std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::operator++
                ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_> *)os
                );
    }
  }
  return;
}

Assistant:

void dumpBBs(DependenceGraph<NodeT> *graph, int ind = 1) {
        for (auto it : graph->getBlocks())
            dumpBB(it.second, ind);

        // print CFG edges between BBs
        if (options & (PRINT_CFG | PRINT_REV_CFG)) {
            out << Indent(ind) << "/* CFG edges */\n";
            for (auto it : graph->getBlocks())
                dumpBBedges(it.second, ind);
        }
    }